

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultipleShootingSolver.cpp
# Opt level: O2

MeshPointOrigin * iDynTree::optimalcontrol::MeshPointOrigin::Control(void)

{
  MeshPointOrigin *in_RDI;
  allocator<char> local_4a;
  allocator<char> local_49;
  string local_48;
  string local_28;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"Control",&local_49);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"A control mesh",&local_4a)
  ;
  MeshPointOrigin(in_RDI,&local_28,7,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  return in_RDI;
}

Assistant:

static MeshPointOrigin Control() {return MeshPointOrigin("Control", 7, "A control mesh");}